

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gausslobatto.hpp
# Opt level: O2

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
IntegratorXX::quadrature_traits<IntegratorXX::GaussLobatto<double,_double>,_void>::generate
          (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,size_t npts)

{
  runtime_error *this;
  int iVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  weight_container weights;
  point_container points;
  tuple<double,_double,_double> local_60;
  double local_48;
  double dStack_40;
  
  std::vector<double,_std::allocator<double>_>::vector(&points,npts,(allocator_type *)&weights);
  std::vector<double,_std::allocator<double>_>::vector(&weights,npts,(allocator_type *)&local_60);
  auVar6._8_4_ = (int)(npts >> 0x20);
  auVar6._0_8_ = npts;
  auVar6._12_4_ = 0x45300000;
  dStack_40 = auVar6._8_8_ - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)npts) - 4503599627370496.0);
  dVar4 = local_48 + -1.0;
  dVar7 = 2.0 / (dVar4 * local_48);
  uVar2 = 1;
  do {
    if (npts + 1 >> 1 <= uVar2) {
      *points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -1.0;
      *weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = dVar7;
      points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[npts - 1] = 1.0;
      weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[npts - 1] = dVar7;
      if ((npts & 1) != 0) {
        *(undefined8 *)
         ((long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + (npts & 0xfffffffffffffffe) * 4) = 0;
      }
      std::
      _Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
      ::
      _Tuple_impl<std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,void>
                ((_Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
                  *)__return_storage_ptr__,&points,&weights);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&weights.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&points.super__Vector_base<double,_std::allocator<double>_>);
      return __return_storage_ptr__;
    }
    lVar3 = (npts - 1) - uVar2;
    auVar9._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar9._0_8_ = lVar3;
    auVar9._12_4_ = 0x45300000;
    dVar5 = cos((((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * 3.141592653589793
                ) / dVar4);
    iVar1 = 0x65;
    do {
      iVar1 = iVar1 + -1;
      if (iVar1 == 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Gauss-Lobatto Newton Iterations Failed to Converge")
        ;
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      eval_Pn<double>(&local_60,dVar5,npts - 1);
      dVar8 = dVar5 - (dVar5 * local_60.super__Tuple_impl<0UL,_double,_double,_double>.
                               super__Head_base<0UL,_double,_false>._M_head_impl -
                      (double)local_60.super__Tuple_impl<0UL,_double,_double,_double>.
                              super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
                              super__Head_base<2UL,_double,_false>._M_head_impl) /
                      (local_60.super__Tuple_impl<0UL,_double,_double,_double>.
                       super__Head_base<0UL,_double,_false>._M_head_impl * local_48);
      dVar10 = dVar8 - dVar5;
      dVar5 = dVar8;
    } while (2.220446049250313e-16 < ABS(dVar10));
    dVar5 = dVar7 / (local_60.super__Tuple_impl<0UL,_double,_double,_double>.
                     super__Head_base<0UL,_double,_false>._M_head_impl *
                    local_60.super__Tuple_impl<0UL,_double,_double,_double>.
                    super__Head_base<0UL,_double,_false>._M_head_impl);
    points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar2] = dVar8;
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar2] = dVar5;
    points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar3] = -dVar8;
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar3] = dVar5;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

inline static std::tuple<point_container, weight_container> generate(
      size_t npts) {
    point_container points(npts);
    weight_container weights(npts);

    // Absolute precision for the nodes
    const auto eps = std::numeric_limits<double>::epsilon();

    // 2/(n(n-1)) appears in many expressions
    weight_type two_ov_nnm1 = 2.0 / (npts * (npts - 1.0));

    // Since the rules are symmetric around the origin, we only need
    // to compute one half of the points
    const size_t mid = (npts+1) / 2;
    for(size_t idx = 1; idx < mid; ++idx) {
      // Initial guess
      const point_type i = npts - 1 - idx;
      point_type z = cos (i * M_PI / ( npts - 1.0));

      // Old value of root
      point_type z_old = -2.0;
      // Values of P_{n-1}(x), dP_{n-1}/dx, P_{n-2}(x)
      point_type p_nm1, p_nm2;

      // Solve the root to eps absolute precision
      bool converged = false;
      const int maxit = 100;
      for(int it = 0; it < maxit; ++it) {
        // Evaluate the Legendre polynomial at z and its derivative
        std::tie(p_nm1, std::ignore, p_nm2) = IntegratorXX::eval_Pn(z, npts - 1);

        // Newton update for the root. This equation might look
        // peculiar, but it is correct: you can derive it by using
        // Newton's method to search for the roots of f(x) = (x^2-1)
        // P_{n}'(x), and using the differential equation satisfied by
        // the Legendre polynomials to find that f'(x) = n(n+1)
        // P_{n}(x).
        z_old = z;
        z -= (z*p_nm1 - p_nm2) / (npts*p_nm1);
        // Convergence check
        if(std::abs(z - z_old) <= eps) {
          converged = true;
          break;
        }
      }  // end while

      if(not converged) {
        throw std::runtime_error(
            "Gauss-Lobatto Newton Iterations Failed to Converge");
      }

      // Quadrature node is z
      point_type pt = z;
      // Quadrature weight is 2 / [n (n-1) (1-x^2) P_{n-1}(x)^2]
      weight_type wgt = two_ov_nnm1 / (p_nm1 * p_nm1);

      // Store the symmetric points
      points[idx] = pt;
      weights[idx] = wgt;

      points[npts - 1 - idx] = -pt;
      weights[npts - 1 - idx] = wgt;
    }  // Loop over points

    // Nodes and weights of the end points
    points[0] = -1.0;
    weights[0] = two_ov_nnm1;
    points[npts - 1] = 1.0;
    weights[npts - 1] = two_ov_nnm1;

    if(npts%2==1) {
      // Rule with even number of points has a node at the origin
      points[npts/2]=0.0;
    }

    return std::make_tuple(points, weights);
  }